

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O1

double __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::project_to_R
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,int number_of_function)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  pvVar1 = (this->heat_map).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->heat_map).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar3 != 0) {
    dVar7 = 0.0;
    lVar4 = 0;
    do {
      lVar2 = *(long *)&pvVar1[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar5 = (long)*(pointer *)
                     ((long)&pvVar1[lVar4].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + 8) - lVar2;
      if (lVar5 != 0) {
        lVar6 = 0;
        do {
          dVar7 = dVar7 + *(double *)(lVar2 + lVar6 * 8);
          lVar6 = lVar6 + 1;
        } while (lVar5 >> 3 != lVar6);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != (lVar3 >> 3) * -0x5555555555555555);
    return dVar7;
  }
  return 0.0;
}

Assistant:

double Persistence_heat_maps<Scalling_of_kernels>::project_to_R(int number_of_function) const {
  double result = 0;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      result += this->heat_map[i][j];
    }
  }
  return result;
}